

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v11::detail::vformat_to(buffer<char> *buf,string_view fmt,format_args args,locale_ref loc)

{
  basic_appender<char> out;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *p_Var1;
  undefined1 value [16];
  undefined1 value_00 [16];
  bool bVar2;
  format_handler<char> *pfVar3;
  format_handler<char> *handler;
  char *pcVar4;
  float value_01;
  buffer<char> *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar5;
  type tVar6;
  basic_string_view<char> fmt_00;
  undefined8 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff62;
  default_arg_formatter<char> local_90;
  parse_context<char> local_88;
  undefined1 local_68 [8];
  format_args local_60;
  locale_ref local_50;
  format_handler<char> *local_48;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_40;
  void *local_38;
  
  local_60.field_1._4_4_ = (undefined4)(local_60.desc_ >> 0x20);
  aVar5 = args.field_1;
  pfVar3 = (format_handler<char> *)args.desc_;
  pcVar4 = (char *)fmt.size_;
  this = (buffer<char> *)fmt.data_;
  handler = pfVar3;
  if ((pcVar4 == (char *)0x2) && (bVar2 = equal2((char *)this,"{}"), bVar2)) {
    if ((long)pfVar3 < 0) {
      if ((int)(type)args.desc_ < 1) goto switchD_00174ca7_default;
      tVar6 = (aVar5.args_)->type_;
    }
    else {
      tVar6 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0)
      goto switchD_00174ca7_default;
    }
    out.container = *(buffer<char> **)&(aVar5.values_)->field_0;
    p_Var1 = ((aVar5.values_)->field_0).custom.format;
    value_01 = SUB84(out.container,0);
    local_90.out.container = (basic_appender<char>)(basic_appender<char>)buf;
    switch(tVar6) {
    case int_type:
      write<char,_fmt::v11::basic_appender<char>,_int,_0>((basic_appender<char>)buf,(int)value_01);
      break;
    case uint_type:
      write<char,_fmt::v11::basic_appender<char>,_unsigned_int,_0>
                ((basic_appender<char>)buf,(uint)value_01);
      break;
    case long_long_type:
      write<char,_fmt::v11::basic_appender<char>,_long_long,_0>
                ((basic_appender<char>)buf,(longlong)out.container);
      break;
    case ulong_long_type:
      write<char,_fmt::v11::basic_appender<char>,_unsigned_long_long,_0>
                ((basic_appender<char>)buf,(unsigned_long_long)out.container);
      break;
    case int128_type:
      value._8_2_ = in_stack_ffffffffffffff60;
      value._0_8_ = in_stack_ffffffffffffff58;
      value._10_6_ = in_stack_ffffffffffffff62;
      write<char,_fmt::v11::basic_appender<char>,___int128,_0>((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      value_00._8_2_ = in_stack_ffffffffffffff60;
      value_00._0_8_ = in_stack_ffffffffffffff58;
      value_00._10_6_ = in_stack_ffffffffffffff62;
      write<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
                ((detail *)buf,out,(unsigned___int128)value_00);
      break;
    case bool_type:
      default_arg_formatter<char>::operator()<bool,_0>(&local_90,(bool)((byte)out.container & 1));
      break;
    case char_type:
      write<char,fmt::v11::basic_appender<char>>((basic_appender<char>)buf,(byte)out.container);
      break;
    case float_type:
      write<char,_fmt::v11::basic_appender<char>,_float,_0>((basic_appender<char>)buf,value_01);
      break;
    case double_type:
      write<char,_fmt::v11::basic_appender<char>,_double,_0>
                ((basic_appender<char>)buf,(double)out.container);
      break;
    case last_numeric_type:
      write<char,_fmt::v11::basic_appender<char>,_long_double,_0>
                ((basic_appender<char>)buf,((aVar5.values_)->field_0).long_double_value);
      break;
    case cstring_type:
      write<char,fmt::v11::basic_appender<char>>((basic_appender<char>)buf,(char *)out.container);
      break;
    case string_type:
      copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                ((char *)out.container,(char *)(p_Var1 + (long)out.container),
                 (basic_appender<char>)buf);
      break;
    case pointer_type:
      default_arg_formatter<char>::operator()<const_void_*,_0>(&local_90,out.container);
      break;
    case custom_type:
      local_88.next_arg_id_ = 0;
      local_88.fmt_.data_ = (char *)0x0;
      local_88.fmt_.size_ = 0;
      local_60.desc_ = 0;
      local_60.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)0x0;
      local_50.locale_ = (void *)0x0;
      local_68 = (undefined1  [8])buf;
      (*p_Var1)(out.container,&local_88,(context *)local_68);
      break;
    default:
switchD_00174ca7_default:
      report_error("argument not found");
    }
  }
  else {
    local_60.field_1._0_4_ = 0;
    local_60.desc_ = (unsigned_long_long)pcVar4;
    fmt_00.size_ = (size_t)local_68;
    fmt_00.data_ = pcVar4;
    local_68 = (undefined1  [8])this;
    local_50.locale_ = buf;
    local_48 = pfVar3;
    local_40 = aVar5;
    local_38 = loc.locale_;
    parse_format_string<char,fmt::v11::detail::format_handler<char>>((detail *)this,fmt_00,handler);
  }
  return;
}

Assistant:

FMT_FUNC void vformat_to(buffer<char>& buf, string_view fmt, format_args args,
                         locale_ref loc) {
  auto out = appender(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}"))
    return args.get(0).visit(default_arg_formatter<char>{out});
  parse_format_string(
      fmt, format_handler<char>{parse_context<char>(fmt), {out, args, loc}});
}